

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  bool held;
  bool hovered;
  ImVec2 center;
  ImRect bb;
  bool local_7a;
  bool local_79;
  ImVec2 local_78;
  float local_6c;
  float local_68;
  ImRect local_58;
  ImVec4 local_48;
  ImVec2 local_30;
  
  pIVar2 = GImGui->CurrentWindow;
  local_58.Min.x = pos->x - radius;
  local_58.Min.y = pos->y - radius;
  local_58.Max.x = pos->x + radius;
  local_58.Max.y = pos->y + radius;
  local_68 = radius;
  bVar7 = ItemAdd(&local_58,id,(ImRect *)0x0);
  bVar8 = ButtonBehavior(&local_58,id,&local_79,&local_7a,0);
  if (bVar7) {
    local_78.x = (local_58.Min.x + local_58.Max.x) * 0.5;
    local_78.y = (local_58.Min.y + local_58.Max.y) * 0.5;
    if (local_79 == true) {
      this = pIVar2->DrawList;
      local_6c = 2.0;
      if (2.0 <= local_68) {
        local_6c = local_68;
      }
      pIVar1 = (GImGui->Style).Colors + (ulong)local_7a + 0x16;
      local_48.x = pIVar1->x;
      local_48.y = pIVar1->y;
      uVar3 = pIVar1->z;
      uVar4 = pIVar1->w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar4;
      local_48.z = (float)uVar3;
      IVar9 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddCircleFilled(this,&local_78,local_6c,IVar9,9);
    }
    local_68 = local_68 * 0.7071 + -1.0;
    local_48.x = (GImGui->Style).Colors[0].x;
    local_48.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_48.w = (GImGui->Style).Alpha * (float)uVar6;
    local_48.z = (float)uVar5;
    IVar9 = ColorConvertFloat4ToU32(&local_48);
    local_78.x = local_78.x + -0.5;
    local_78.y = local_78.y + -0.5;
    local_48.y = local_68 + local_78.y;
    local_48.x = local_68 + local_78.x;
    local_30.y = local_78.y - local_68;
    local_30.x = local_78.x - local_68;
    ImDrawList::AddLine(pIVar2->DrawList,(ImVec2 *)&local_48,&local_30,IVar9,1.0);
    local_48.y = local_78.y - local_68;
    local_48.x = local_68 + local_78.x;
    local_30.y = local_68 + local_78.y;
    local_30.x = local_78.x - local_68;
    ImDrawList::AddLine(pIVar2->DrawList,(ImVec2 *)&local_48,&local_30,IVar9,1.0);
  }
  return bVar8;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered), 9);

    float cross_extent = (radius * 0.7071f) - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}